

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O2

int QRsol(int n,realtype **h,realtype *q,realtype *b)

{
  long lVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  lVar7 = 0;
  uVar9 = 0;
  if (0 < n) {
    uVar9 = (ulong)(uint)n;
  }
  for (; uVar9 * 8 != lVar7; lVar7 = lVar7 + 8) {
    pdVar2 = (double *)((long)q + lVar7 * 2);
    dVar5 = *pdVar2;
    dVar6 = pdVar2[1];
    dVar3 = *(double *)((long)b + lVar7);
    dVar4 = *(double *)((long)b + lVar7 + 8);
    *(double *)((long)b + lVar7) = dVar3 * dVar5 + -dVar6 * dVar4;
    ((double *)((long)b + lVar7))[1] = dVar3 * dVar6 + dVar5 * dVar4;
  }
  lVar7 = (long)n;
  while( true ) {
    if (lVar7 < 1) {
      return 0;
    }
    lVar1 = lVar7 + -1;
    dVar3 = h[lVar1][lVar1];
    if ((dVar3 == 0.0) && (!NAN(dVar3))) break;
    b[lVar1] = b[lVar1] / dVar3;
    for (lVar8 = 0; lVar7 = lVar1, lVar8 < lVar1; lVar8 = lVar8 + 1) {
      b[lVar8] = b[lVar8] - b[lVar1] * h[lVar8][lVar1];
    }
  }
  return (int)lVar7;
}

Assistant:

int QRsol(int n, realtype **h, realtype *q, realtype *b)
{
  realtype c, s, temp1, temp2;
  int i, k, q_ptr, code=0;

  /* Compute Q*b */
  
  for (k=0; k < n; k++) {
    q_ptr = 2*k;
    c = q[q_ptr];
    s = q[q_ptr+1];
    temp1 = b[k];
    temp2 = b[k+1];
    b[k] = c*temp1 - s*temp2;
    b[k+1] = s*temp1 + c*temp2;
  }

  /* Solve  R*x = Q*b */

  for (k=n-1; k >= 0; k--) {
    if (h[k][k] == ZERO) {
      code = k + 1;
      break;
    }
    b[k] /= h[k][k];
    for (i=0; i < k; i++) b[i] -= b[k]*h[i][k];
  }
  
  return (code);
}